

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidFace(ON_Brep *this,int face_index,ON_TextLog *text_log)

{
  ON_Surface *pOVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ON_BrepFace *this_00;
  uint *puVar6;
  ON_BrepLoop *pOVar7;
  ON_Surface **ppOVar8;
  ON_Surface *pOVar9;
  int si;
  ON_BrepLoop *loop;
  int li;
  int fli;
  int i;
  int face_loop_count;
  ON_BrepFace *face;
  ON_TextLog *text_log_local;
  int face_index_local;
  ON_Brep *this_local;
  
  if ((face_index < 0) ||
     (iVar3 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
     iVar3 <= face_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar4 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
      ON_TextLog::Print(text_log,"brep face_index = %d (should be >=0 and <%d=brep.m_F.Count()).\n",
                        (ulong)(uint)face_index,(ulong)uVar4);
    }
    this_local._7_1_ = ON_BrepIsNotValid();
  }
  else {
    this_00 = ON_ClassArray<ON_BrepFace>::operator[]
                        ((ON_ClassArray<ON_BrepFace> *)&this->m_F,face_index);
    if (this_00->m_face_index == face_index) {
      if (this_00->m_brep == this) {
        iVar3 = ON_SimpleArray<int>::Count(&this_00->m_li);
        if (iVar3 < 1) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",(ulong)(uint)face_index);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"face.m_li.Count() <= 0 (should be >= 1)\n");
            ON_TextLog::PopIndent(text_log);
          }
          this_local._7_1_ = ON_BrepIsNotValid();
        }
        else {
          for (loop._4_4_ = 0; (int)loop._4_4_ < iVar3; loop._4_4_ = loop._4_4_ + 1) {
            puVar6 = (uint *)ON_SimpleArray<int>::operator[](&this_00->m_li,loop._4_4_);
            uVar4 = *puVar6;
            for (li = 0; li < (int)loop._4_4_; li = li + 1) {
              puVar6 = (uint *)ON_SimpleArray<int>::operator[](&this_00->m_li,li);
              if (*puVar6 == uVar4) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                    (ulong)(uint)face_index);
                  ON_TextLog::PushIndent(text_log);
                  ON_TextLog::Print(text_log,
                                    "face.m_li[%d]=face.m_li[%d]=%d (a loop index should appear once in face.m_li[])\n"
                                    ,(ulong)loop._4_4_,(ulong)(uint)li,(ulong)uVar4);
                  ON_TextLog::PopIndent(text_log);
                }
                bVar2 = ON_BrepIsNotValid();
                return bVar2;
              }
            }
            bVar2 = IsValidLoop(this,uVar4,text_log);
            if (!bVar2) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                  (ulong)(uint)face_index);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,"brep.m_L[face.m_li[%d]=%d] is not valid.\n",
                                  (ulong)loop._4_4_,(ulong)uVar4);
                ON_TextLog::PopIndent(text_log);
              }
              bVar2 = ON_BrepIsNotValid();
              return bVar2;
            }
            pOVar7 = ON_ClassArray<ON_BrepLoop>::operator[]
                               ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,uVar4);
            if (pOVar7->m_loop_index != uVar4) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                  (ulong)(uint)face_index);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,"face.m_li[%d]=%d is a deleted loop\n",(ulong)loop._4_4_,
                                  (ulong)uVar4);
                ON_TextLog::PopIndent(text_log);
              }
              bVar2 = ON_BrepIsNotValid();
              return bVar2;
            }
            if (pOVar7->m_fi != face_index) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                  (ulong)(uint)face_index);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,
                                  "face.m_li[%d]=%d but brep.m_L[%d].m_fi=%d (m_fi should be %d)\n",
                                  (ulong)loop._4_4_,(ulong)uVar4,(ulong)uVar4,
                                  (ulong)(uint)pOVar7->m_fi,face_index);
                ON_TextLog::PopIndent(text_log);
              }
              bVar2 = ON_BrepIsNotValid();
              return bVar2;
            }
            if (loop._4_4_ == 0) {
              if (pOVar7->m_type != outer) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                    (ulong)(uint)face_index);
                  ON_TextLog::PushIndent(text_log);
                  ON_TextLog::Print(text_log,"brep.m_L[face.m_li[0]=%d].m_type is not outer.\n",
                                    (ulong)uVar4);
                  ON_TextLog::PopIndent(text_log);
                }
                bVar2 = ON_BrepIsNotValid();
                return bVar2;
              }
            }
            else if ((pOVar7->m_type != slit) && (pOVar7->m_type != inner)) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                  (ulong)(uint)face_index);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,
                                  "brep.m_L[face.m_li[%d]=%d].m_type is not inner or slit.\n",
                                  (ulong)loop._4_4_,(ulong)uVar4);
                ON_TextLog::PopIndent(text_log);
              }
              bVar2 = ON_BrepIsNotValid();
              return bVar2;
            }
          }
          uVar4 = this_00->m_si;
          if (((int)uVar4 < 0) ||
             (iVar3 = ON_SimpleArray<ON_Surface_*>::Count
                                (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>),
             iVar3 <= (int)uVar4)) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",(ulong)(uint)face_index
                               );
              ON_TextLog::PushIndent(text_log);
              uVar4 = this_00->m_si;
              uVar5 = ON_SimpleArray<ON_Surface_*>::Count
                                (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
              ON_TextLog::Print(text_log,"face.m_si=%d (should be >=0 and <%d=m_S.Count())\n",
                                (ulong)uVar4,(ulong)uVar5);
              ON_TextLog::PopIndent(text_log);
            }
            this_local._7_1_ = ON_BrepIsNotValid();
          }
          else {
            ppOVar8 = ON_SimpleArray<ON_Surface_*>::operator[]
                                (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,uVar4);
            if (*ppOVar8 == (ON_Surface *)0x0) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                  (ulong)(uint)face_index);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,"brep.m_S[face.m_si=%d] is nullptr\n",
                                  (ulong)(uint)this_00->m_si);
                ON_TextLog::PopIndent(text_log);
              }
              this_local._7_1_ = ON_BrepIsNotValid();
            }
            else {
              ppOVar8 = ON_SimpleArray<ON_Surface_*>::operator[]
                                  (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,uVar4);
              pOVar1 = *ppOVar8;
              pOVar9 = ON_SurfaceProxy::ProxySurface(&this_00->super_ON_SurfaceProxy);
              if (pOVar1 == pOVar9) {
                bVar2 = ON_SurfaceProxy::ProxySurfaceIsTransposed(&this_00->super_ON_SurfaceProxy);
                if (bVar2) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                      (ulong)(uint)face_index);
                    ON_TextLog::PushIndent(text_log);
                    ON_TextLog::Print(text_log,"face.ProxySurfaceIsTransposed() is true.\n");
                    ON_TextLog::PopIndent(text_log);
                  }
                  this_local._7_1_ = ON_BrepIsNotValid();
                }
                else {
                  this_local._7_1_ = true;
                }
              }
              else {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",
                                    (ulong)(uint)face_index);
                  ON_TextLog::PushIndent(text_log);
                  ON_TextLog::Print(text_log,"brep.m_S[face.m_si=%d] != face.ProxySurface().\n",
                                    (ulong)uVar4);
                  ON_TextLog::PopIndent(text_log);
                }
                this_local._7_1_ = ON_BrepIsNotValid();
              }
            }
          }
        }
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",(ulong)(uint)face_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"face.m_brep does not point to parent brep.\n");
          ON_TextLog::PopIndent(text_log);
        }
        this_local._7_1_ = ON_BrepIsNotValid();
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",(ulong)(uint)face_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"face.m_face_index = %d (should be %d).\n",
                          (ulong)(uint)this_00->m_face_index,(ulong)(uint)face_index);
        ON_TextLog::PopIndent(text_log);
      }
      this_local._7_1_ = ON_BrepIsNotValid();
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_Brep::IsValidFace( int face_index, ON_TextLog* text_log  ) const
{
  if ( face_index < 0 || face_index >= m_F.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep face_index = %d (should be >=0 and <%d=brep.m_F.Count()).\n",
                      face_index, m_F.Count());
    }
    return ON_BrepIsNotValid();
  }
  const ON_BrepFace& face = m_F[face_index];
  if ( face.m_face_index != face_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_face_index = %d (should be %d).\n",
                       face.m_face_index, face_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( face.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_brep does not point to parent brep.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  const int face_loop_count = face.m_li.Count();
  if ( face_loop_count <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_li.Count() <= 0 (should be >= 1)\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  int i, fli, li;
  for ( fli = 0; fli < face_loop_count; fli++ ) 
  {
    li = face.m_li[fli];
    for ( i = 0; i < fli; i++ ) 
    {
      if ( face.m_li[i] == li )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("face.m_li[%d]=face.m_li[%d]=%d (a loop index should appear once in face.m_li[])\n",
                          fli,i,li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    if ( !IsValidLoop( li, text_log ) )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("brep.m_L[face.m_li[%d]=%d] is not valid.\n",fli,li);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepLoop& loop = m_L[li];
    if ( loop.m_loop_index != li )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("face.m_li[%d]=%d is a deleted loop\n",
                        fli,li);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( loop.m_fi != face_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("face.m_li[%d]=%d but brep.m_L[%d].m_fi=%d (m_fi should be %d)\n",
                        fli,li,li,loop.m_fi,face_index);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( fli == 0 ) 
    {
      if ( loop.m_type != ON_BrepLoop::outer )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("brep.m_L[face.m_li[0]=%d].m_type is not outer.\n",li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    else
    {
      if (   loop.m_type != ON_BrepLoop::slit 
           && loop.m_type != ON_BrepLoop::inner 
         )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("brep.m_L[face.m_li[%d]=%d].m_type is not inner or slit.\n",fli,li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
  }

  const int si = face.m_si;
  if ( si < 0 || si >= m_S.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_si=%d (should be >=0 and <%d=m_S.Count())\n",
                      face.m_si,m_S.Count());                      
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( !m_S[si] )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("brep.m_S[face.m_si=%d] is nullptr\n",face.m_si);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( m_S[si] != face.ProxySurface() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("brep.m_S[face.m_si=%d] != face.ProxySurface().\n",si);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( face.ProxySurfaceIsTransposed() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.ProxySurfaceIsTransposed() is true.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  return true; 
}